

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.h
# Opt level: O0

void * ncnn::fastMalloc(size_t size)

{
  int iVar1;
  size_t in_RDI;
  void *ptr;
  void *local_10 [2];
  
  local_10[0] = (void *)0x0;
  iVar1 = posix_memalign(local_10,0x10,in_RDI);
  if (iVar1 != 0) {
    local_10[0] = (void *)0x0;
  }
  return local_10[0];
}

Assistant:

static inline void* fastMalloc(size_t size)
{
#if _MSC_VER
    return _aligned_malloc(size, MALLOC_ALIGN);
#elif _POSIX_C_SOURCE >= 200112L || (__ANDROID__ && __ANDROID_API__ >= 17)
    void* ptr = 0;
    if (posix_memalign(&ptr, MALLOC_ALIGN, size))
        ptr = 0;
    return ptr;
#elif __ANDROID__ && __ANDROID_API__ < 17
    return memalign(MALLOC_ALIGN, size);
#else
    unsigned char* udata = (unsigned char*)malloc(size + sizeof(void*) + MALLOC_ALIGN);
    if (!udata)
        return 0;
    unsigned char** adata = alignPtr((unsigned char**)udata + 1, MALLOC_ALIGN);
    adata[-1] = udata;
    return adata;
#endif
}